

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tet_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tet,REF_DBL *ideal_location)

{
  double dVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  double dVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  double dVar11;
  double dVar12;
  REF_DBL dn [3];
  REF_DBL m [6];
  REF_INT tri_nodes [27];
  REF_INT nodes [27];
  REF_DBL log_m [6];
  REF_DBL log_m3 [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  double local_248 [4];
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  int local_1f8 [28];
  REF_INT local_188 [28];
  REF_DBL local_118;
  double adStack_110 [5];
  REF_DBL local_e8;
  double local_e0 [5];
  REF_DBL local_b8;
  double local_b0 [5];
  REF_DBL local_88;
  double local_80 [5];
  REF_DBL local_58;
  double adStack_50 [5];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  uVar5 = ref_cell_nodes(ref_cell,tet,local_188);
  if (uVar5 == 0) {
    local_1f8[0] = -1;
    local_1f8[1] = -1;
    local_1f8[2] = -1;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (local_188[lVar7] == node) {
        pRVar2 = ref_cell->f2n;
        lVar9 = 0;
        do {
          local_1f8[lVar9] = local_188[*(int *)((long)pRVar2 + lVar9 * 4 + lVar6)];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 != 4);
    if (local_1f8[2] == -1 || (local_1f8[1] == -1 || (long)local_1f8[0] == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x538,"ref_smooth_tet_ideal","empty tetrahedra face");
      return 1;
    }
    pRVar3 = ref_node->real;
    lVar6 = 0;
    do {
      ideal_location[lVar6] =
           (pRVar3[(long)local_1f8[0] * 0xf + lVar6] + pRVar3[(long)local_1f8[1] * 0xf + lVar6] +
           pRVar3[(long)local_1f8[2] * 0xf + lVar6]) / 3.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    uVar5 = ref_node_tri_normal(ref_node,local_1f8,local_248);
    if (uVar5 == 0) {
      uVar5 = ref_math_normalize(local_248);
      if (uVar5 == 0) {
        uVar5 = ref_node_metric_get_log(ref_node,local_188[0],&local_58);
        if (uVar5 == 0) {
          uVar5 = ref_node_metric_get_log(ref_node,local_188[1],&local_88);
          if (uVar5 == 0) {
            uVar5 = ref_node_metric_get_log(ref_node,local_188[2],&local_b8);
            if (uVar5 == 0) {
              uVar5 = ref_node_metric_get_log(ref_node,local_188[3],&local_e8);
              if (uVar5 == 0) {
                lVar6 = 0;
                do {
                  dVar4 = adStack_50[lVar6];
                  dVar11 = local_80[lVar6];
                  dVar12 = local_b0[lVar6];
                  dVar1 = local_e0[lVar6];
                  adStack_110[lVar6 + -1] =
                       (adStack_50[lVar6 + -1] + local_80[lVar6 + -1] + local_b0[lVar6 + -1] +
                       local_e0[lVar6 + -1]) * 0.25;
                  adStack_110[lVar6] = (dVar4 + dVar11 + dVar12 + dVar1) * 0.25;
                  lVar6 = lVar6 + 2;
                } while (lVar6 != 6);
                uVar5 = ref_matrix_exp_m(&local_118,&local_228);
                if (uVar5 == 0) {
                  dVar11 = (local_200 * local_248[2] +
                           local_218 * local_248[0] + local_248[1] * local_208) * local_248[2] +
                           (local_218 * local_248[2] +
                           local_228 * local_248[0] + local_220 * local_248[1]) * local_248[0] +
                           (local_208 * local_248[2] +
                           local_220 * local_248[0] + local_210 * local_248[1]) * local_248[1];
                  if (dVar11 < 0.0) {
                    dVar11 = sqrt(dVar11);
                  }
                  else {
                    dVar11 = SQRT(dVar11);
                  }
                  dVar12 = dVar11 * 1e+20;
                  if (dVar12 <= -dVar12) {
                    dVar12 = -dVar12;
                  }
                  if (0.8164965809277259 < dVar12) {
                    lVar6 = 0;
                    do {
                      ideal_location[lVar6] =
                           local_248[lVar6] * (0.8164965809277259 / dVar11) + ideal_location[lVar6];
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 3);
                    return 0;
                  }
                  printf(" length_in_metric = %e, not invertible\n");
                  return 4;
                }
                pcVar10 = "exp avg";
                uVar8 = 0x54b;
              }
              else {
                pcVar10 = "get n3 log m";
                uVar8 = 0x548;
              }
            }
            else {
              pcVar10 = "get n2 log m";
              uVar8 = 0x547;
            }
          }
          else {
            pcVar10 = "get n1 log m";
            uVar8 = 0x546;
          }
        }
        else {
          pcVar10 = "get n0 log m";
          uVar8 = 0x545;
        }
      }
      else {
        pcVar10 = "normalize direction";
        uVar8 = 0x542;
      }
    }
    else {
      pcVar10 = "tri normal";
      uVar8 = 0x540;
    }
  }
  else {
    pcVar10 = "get tri";
    uVar8 = 0x52c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar8,
         "ref_smooth_tet_ideal",(ulong)uVar5,pcVar10);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tet, REF_DBL *ideal_location) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_node, tri_node;
  REF_INT ixyz;
  REF_DBL dn[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m3[6], log_m[6];
  REF_DBL m[6];
  REF_DBL scale, length_in_metric;
  REF_INT i;

  RSS(ref_cell_nodes(ref_cell, tet, nodes), "get tri");
  tri_nodes[0] = REF_EMPTY;
  tri_nodes[1] = REF_EMPTY;
  tri_nodes[2] = REF_EMPTY;
  for (tet_node = 0; tet_node < 4; tet_node++)
    if (node == nodes[tet_node]) {
      for (tri_node = 0; tri_node < 3; tri_node++)
        tri_nodes[tri_node] =
            nodes[ref_cell_f2n_gen(ref_cell, tri_node, tet_node)];
    }
  if (tri_nodes[0] == REF_EMPTY || tri_nodes[1] == REF_EMPTY ||
      tri_nodes[2] == REF_EMPTY)
    THROW("empty tetrahedra face");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = (ref_node_xyz(ref_node, ixyz, tri_nodes[0]) +
                            ref_node_xyz(ref_node, ixyz, tri_nodes[1]) +
                            ref_node_xyz(ref_node, ixyz, tri_nodes[2])) /
                           3.0;

  RSS(ref_node_tri_normal(ref_node, tri_nodes, dn), "tri normal");

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, nodes[0], log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], log_m2), "get n2 log m");
  RSS(ref_node_metric_get_log(ref_node, nodes[3], log_m3), "get n3 log m");
  for (i = 0; i < 6; i++)
    log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i] + log_m3[i]) * 0.25;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = sqrt(6.0) / 3.0; /* altitude of regular tetrahedra */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}